

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O0

void __thiscall VectorLattice_JoinSingleton_Test::TestBody(VectorLattice_JoinSingleton_Test *this)

{
  initializer_list<bool> __l;
  initializer_list<bool> __l_00;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_1e0;
  Message local_1d8;
  allocator<bool> local_1cb;
  bool local_1ca [2];
  iterator local_1c8;
  size_type local_1c0;
  vector<bool,_std::allocator<bool>_> local_1b8;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_160;
  Message local_158;
  Element local_149;
  SingletonElement local_148;
  bool local_131;
  undefined1 local_130 [8];
  AssertionResult gtest_ar__1;
  Message local_118;
  allocator<bool> local_10b;
  bool local_10a [2];
  iterator local_108;
  size_type local_100;
  vector<bool,_std::allocator<bool>_> local_f8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  AssertHelper local_a0;
  Message local_98 [3];
  Element local_79;
  SingletonElement local_78;
  bool local_61;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_;
  Element elem;
  undefined1 local_20 [8];
  Vec vector;
  VectorLattice_JoinSingleton_Test *this_local;
  
  vector.size = (size_t)this;
  ::wasm::analysis::Vector<wasm::analysis::Bool>::Vector
            ((Vector<wasm::analysis::Bool> *)local_20,
             (Bool *)((long)&elem.super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_end_of_storage + 7),2);
  ::wasm::analysis::Vector<wasm::analysis::Bool>::getBottom
            ((Element *)&gtest_ar_.message_,(Vector<wasm::analysis::Bool> *)local_20);
  local_79 = false;
  ::wasm::analysis::Vector<wasm::analysis::Bool>::SingletonElement::SingletonElement
            (&local_78,0,&local_79);
  local_61 = ::wasm::analysis::Vector<wasm::analysis::Bool>::join
                       ((Vector<wasm::analysis::Bool> *)local_20,(Element *)&gtest_ar_.message_,
                        &local_78);
  local_61 = !local_61;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_60,&local_61,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_60,
               (AssertionResult *)"vector.join(elem, Vec::SingletonElement(0, false))","true",
               "false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x1e6,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  local_10a[0] = false;
  local_10a[1] = false;
  local_108 = local_10a;
  local_100 = 2;
  std::allocator<bool>::allocator(&local_10b);
  __l_00._M_len = local_100;
  __l_00._M_array = local_108;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_f8,__l_00,&local_10b);
  testing::internal::EqHelper::
  Compare<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>,_nullptr>
            ((EqHelper *)local_d0,"elem","(std::vector{false, false})",
             (vector<bool,_std::allocator<bool>_> *)&gtest_ar_.message_,&local_f8);
  std::vector<bool,_std::allocator<bool>_>::~vector(&local_f8);
  std::allocator<bool>::~allocator(&local_10b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x1e7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  local_149 = true;
  ::wasm::analysis::Vector<wasm::analysis::Bool>::SingletonElement::SingletonElement
            (&local_148,1,&local_149);
  local_131 = ::wasm::analysis::Vector<wasm::analysis::Bool>::join
                        ((Vector<wasm::analysis::Bool> *)local_20,(Element *)&gtest_ar_.message_,
                         &local_148);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_130,&local_131,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_130,
               (AssertionResult *)"vector.join(elem, Vec::SingletonElement(1, true))","false","true"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x1e9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  local_1ca[0] = false;
  local_1ca[1] = true;
  local_1c8 = local_1ca;
  local_1c0 = 2;
  std::allocator<bool>::allocator(&local_1cb);
  __l._M_len = local_1c0;
  __l._M_array = local_1c8;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_1b8,__l,&local_1cb);
  testing::internal::EqHelper::
  Compare<std::vector<bool,_std::allocator<bool>_>,_std::vector<bool,_std::allocator<bool>_>,_nullptr>
            ((EqHelper *)local_190,"elem","(std::vector{false, true})",
             (vector<bool,_std::allocator<bool>_> *)&gtest_ar_.message_,&local_1b8);
  std::vector<bool,_std::allocator<bool>_>::~vector(&local_1b8);
  std::allocator<bool>::~allocator(&local_1cb);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x1ea,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(VectorLattice, JoinSingleton) {
  using Vec = analysis::Vector<analysis::Bool>;
  Vec vector{analysis::Bool{}, 2};
  auto elem = vector.getBottom();

  EXPECT_FALSE(vector.join(elem, Vec::SingletonElement(0, false)));
  EXPECT_EQ(elem, (std::vector{false, false}));

  EXPECT_TRUE(vector.join(elem, Vec::SingletonElement(1, true)));
  EXPECT_EQ(elem, (std::vector{false, true}));
}